

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O3

int pem_aes_decrypt(uchar *aes_iv,uint keylen,uchar *buf,size_t buflen,uchar *pwd,size_t pwdlen)

{
  int iVar1;
  uchar aes_key [32];
  mbedtls_aes_context aes_ctx;
  uchar local_178 [40];
  mbedtls_aes_context local_150;
  
  mbedtls_aes_init(&local_150);
  iVar1 = pem_pbkdf1(local_178,(ulong)keylen,aes_iv,pwd,pwdlen);
  if (iVar1 == 0) {
    iVar1 = mbedtls_aes_setkey_dec(&local_150,local_178,keylen << 3);
    if (iVar1 == 0) {
      iVar1 = mbedtls_aes_crypt_cbc(&local_150,0,buflen,aes_iv,buf,buf);
    }
  }
  mbedtls_aes_free(&local_150);
  mbedtls_platform_zeroize(local_178,(ulong)keylen);
  return iVar1;
}

Assistant:

static int pem_aes_decrypt( unsigned char aes_iv[16], unsigned int keylen,
                            unsigned char *buf, size_t buflen,
                            const unsigned char *pwd, size_t pwdlen )
{
    mbedtls_aes_context aes_ctx;
    unsigned char aes_key[32];
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    mbedtls_aes_init( &aes_ctx );

    if( ( ret = pem_pbkdf1( aes_key, keylen, aes_iv, pwd, pwdlen ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_aes_setkey_dec( &aes_ctx, aes_key, keylen * 8 ) ) != 0 )
        goto exit;
    ret = mbedtls_aes_crypt_cbc( &aes_ctx, MBEDTLS_AES_DECRYPT, buflen,
                     aes_iv, buf, buf );

exit:
    mbedtls_aes_free( &aes_ctx );
    mbedtls_platform_zeroize( aes_key, keylen );

    return( ret );
}